

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O3

void mahjong::adjust_by_win_flag(win_flag_t win_flag,fan_table_t *fan_table)

{
  if ((win_flag & 2) != 0) {
    (*fan_table)[0x3a] = 1;
  }
  if ((win_flag & 8) != 0) {
    (*fan_table)[win_flag & 1 ^ 0x2d] = 1;
  }
  if ((win_flag & 4) != 0) {
    (*fan_table)[win_flag & 1 ^ 0x2f] = 1;
  }
  if ((win_flag & 1) != 0) {
    (*fan_table)[0x50] = 1;
  }
  return;
}

Assistant:

static void adjust_by_win_flag(win_flag_t win_flag, fan_table_t &fan_table) {
    if (win_flag & WIN_FLAG_4TH_TILE) {
        fan_table[LAST_TILE] = 1;
    }
    if (win_flag & WIN_FLAG_WALL_LAST) {
        fan_table[win_flag & WIN_FLAG_SELF_DRAWN ? LAST_TILE_DRAW : LAST_TILE_CLAIM] = 1;
    }
    if (win_flag & WIN_FLAG_ABOUT_KONG) {
        fan_table[win_flag & WIN_FLAG_SELF_DRAWN ? OUT_WITH_REPLACEMENT_TILE : ROBBING_THE_KONG] = 1;
    }
    if (win_flag & WIN_FLAG_SELF_DRAWN) {
        fan_table[SELF_DRAWN] = 1;
    }
}